

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Selectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 *size_arg)

{
  float x1;
  ImVec2 IVar1;
  ImVec2 p_max;
  ImGuiContext *pIVar2;
  ImGuiID id_00;
  ImU32 fill_col;
  ImGuiWindow *this;
  bool bVar3;
  ImGuiCol local_ec;
  float local_e8;
  float local_e4;
  float local_dc;
  float local_d4;
  bool local_af;
  bool local_ae;
  byte local_ad;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  bool was_selected;
  ImGuiButtonFlags button_flags;
  ImGuiItemFlags backup_item_flags;
  float fStack_9c;
  bool item_add;
  float backup_clip_rect_max_x;
  float backup_clip_rect_min_x;
  float spacing_U;
  float spacing_L;
  float spacing_y;
  float spacing_x;
  ImRect bb;
  ImVec2 text_max;
  ImVec2 text_min;
  float max_x;
  float min_x;
  float fStack_58;
  bool span_all_columns;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *size_arg_local;
  ImGuiSelectableFlags flags_local;
  bool selected_local;
  char *label_local;
  
  this = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this,label,(char *)0x0);
    size = CalcTextSize(label,(char *)0x0,true,-1.0);
    if ((size_arg->x != 0.0) || (NAN(size_arg->x))) {
      local_d4 = size_arg->x;
    }
    else {
      local_d4 = size.x;
    }
    if ((size_arg->y != 0.0) || (NAN(size_arg->y))) {
      local_dc = size_arg->y;
    }
    else {
      local_dc = size.y;
    }
    ImVec2::ImVec2(&pos,local_d4,local_dc);
    IVar1 = (this->DC).CursorPos;
    fStack_58 = IVar1.y;
    fStack_58 = (this->DC).CurrLineTextBaseOffset + fStack_58;
    min_x = IVar1.x;
    x1 = min_x;
    ItemSize(&pos,0.0);
    bVar3 = (flags & 2U) != 0;
    if (bVar3) {
      x1 = (this->ParentWorkRect).Min.x;
      local_e4 = (this->ParentWorkRect).Max.x;
    }
    else {
      local_e4 = (this->WorkRect).Max.x;
    }
    if (((size_arg->x == 0.0) && (!NAN(size_arg->x))) || ((flags & 0x800000U) != 0)) {
      pos.x = ImMax<float>(size.x,local_e4 - x1);
    }
    text_max = _min_x;
    ImVec2::ImVec2(&bb.Max,x1 + pos.x,fStack_58 + pos.y);
    ImRect::ImRect((ImRect *)&spacing_y,x1,fStack_58,bb.Max.x,bb.Max.y);
    if ((flags & 0x4000000U) == 0) {
      if (bVar3) {
        local_e8 = 0.0;
      }
      else {
        local_e8 = (pIVar2->Style).ItemSpacing.x;
      }
      spacing_L = local_e8;
      spacing_U = (pIVar2->Style).ItemSpacing.y;
      backup_clip_rect_min_x = (float)(int)(local_e8 * 0.5);
      backup_clip_rect_max_x = (float)(int)(spacing_U * 0.5);
      spacing_y = spacing_y - backup_clip_rect_min_x;
      spacing_x = spacing_x - backup_clip_rect_max_x;
      bb.Min.x = (local_e8 - backup_clip_rect_min_x) + bb.Min.x;
      bb.Min.y = (spacing_U - backup_clip_rect_max_x) + bb.Min.y;
    }
    fStack_9c = (this->ClipRect).Min.x;
    backup_item_flags = (ImGuiItemFlags)(this->ClipRect).Max.x;
    if (bVar3) {
      (this->ClipRect).Min.x = (this->ParentWorkRect).Min.x;
      (this->ClipRect).Max.x = (this->ParentWorkRect).Max.x;
    }
    if ((flags & 8U) == 0) {
      button_flags._3_1_ = ItemAdd((ImRect *)&spacing_y,id_00,(ImRect *)0x0);
    }
    else {
      _pressed = (this->DC).ItemFlags;
      (this->DC).ItemFlags = (this->DC).ItemFlags | 0x14;
      button_flags._3_1_ = ItemAdd((ImRect *)&spacing_y,id_00,(ImRect *)0x0);
      (this->DC).ItemFlags = _pressed;
    }
    if (bVar3) {
      (this->ClipRect).Min.x = fStack_9c;
      (this->ClipRect).Max.x = (float)backup_item_flags;
    }
    if ((bool)button_flags._3_1_ == false) {
      label_local._7_1_ = false;
    }
    else {
      if ((bVar3) && ((this->DC).CurrentColumns != (ImGuiOldColumns *)0x0)) {
        PushColumnsBackground();
      }
      else if ((bVar3) && (pIVar2->CurrentTable != (ImGuiTable *)0x0)) {
        TablePushBackgroundChannel();
      }
      col = 0;
      if ((flags & 0x100000U) != 0) {
        col = 0x20000;
      }
      if ((flags & 0x200000U) != 0) {
        col = col | 0x10;
      }
      if ((flags & 0x400000U) != 0) {
        col = col | 0x80;
      }
      if ((flags & 8U) != 0) {
        col = col | 0x4000;
      }
      if ((flags & 4U) != 0) {
        col = col | 0x120;
      }
      if ((flags & 0x10U) != 0) {
        col = col | 0x1000;
      }
      size_arg_local._7_1_ = selected;
      if ((flags & 8U) != 0) {
        size_arg_local._7_1_ = 0;
      }
      local_ad = size_arg_local._7_1_ & 1;
      label_local._7_1_ = ButtonBehavior((ImRect *)&spacing_y,id_00,&local_ae,&local_af,col);
      if (((label_local._7_1_) || (((local_ae & 1U) != 0 && ((flags & 0x2000000U) != 0)))) &&
         (((pIVar2->NavDisableMouseHover & 1U) == 0 &&
          ((pIVar2->NavWindow == this && (pIVar2->NavLayer == (this->DC).NavLayerCurrent)))))) {
        pIVar2->NavDisableHighlight = true;
        SetNavID(id_00,(this->DC).NavLayerCurrent,(this->DC).NavFocusScopeIdCurrent);
      }
      if (label_local._7_1_) {
        MarkItemEdited(id_00);
      }
      if ((flags & 0x10U) != 0) {
        SetItemAllowOverlap();
      }
      if ((size_arg_local._7_1_ & 1) != (local_ad & 1)) {
        (this->DC).LastItemStatusFlags = (this->DC).LastItemStatusFlags | 8;
      }
      if (((local_af & 1U) != 0) && ((flags & 0x1000000U) != 0)) {
        local_ae = true;
      }
      if (((local_ae & 1U) != 0) || ((size_arg_local._7_1_ & 1) != 0)) {
        if (((local_af & 1U) == 0) || ((local_ae & 1U) == 0)) {
          local_ec = 0x18;
          if ((local_ae & 1U) != 0) {
            local_ec = 0x19;
          }
        }
        else {
          local_ec = 0x1a;
        }
        fill_col = GetColorU32(local_ec,1.0);
        IVar1.y = spacing_x;
        IVar1.x = spacing_y;
        p_max.y = bb.Min.y;
        p_max.x = bb.Min.x;
        RenderFrame(IVar1,p_max,fill_col,false,0.0);
        RenderNavHighlight((ImRect *)&spacing_y,id_00,10);
      }
      if ((bVar3) && ((this->DC).CurrentColumns != (ImGuiOldColumns *)0x0)) {
        PopColumnsBackground();
      }
      else if ((bVar3) && (pIVar2->CurrentTable != (ImGuiTable *)0x0)) {
        TablePopBackgroundChannel();
      }
      if ((flags & 8U) != 0) {
        PushStyleColor(0,(pIVar2->Style).Colors + 1);
      }
      RenderTextClipped(&text_max,&bb.Max,label,(char *)0x0,&size,
                        &(pIVar2->Style).SelectableTextAlign,(ImRect *)&spacing_y);
      if ((flags & 8U) != 0) {
        PopStyleColor(1);
      }
      if ((((label_local._7_1_) && ((this->Flags & 0x4000000U) != 0)) && ((flags & 1U) == 0)) &&
         (((this->DC).ItemFlags & 0x20U) == 0)) {
        CloseCurrentPopup();
      }
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::Selectable(const char* label, bool selected, ImGuiSelectableFlags flags, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    // Submit label or explicit size to ItemSize(), whereas ItemAdd() will submit a larger/spanning rectangle.
    ImGuiID id = window->GetID(label);
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size(size_arg.x != 0.0f ? size_arg.x : label_size.x, size_arg.y != 0.0f ? size_arg.y : label_size.y);
    ImVec2 pos = window->DC.CursorPos;
    pos.y += window->DC.CurrLineTextBaseOffset;
    ItemSize(size, 0.0f);

    // Fill horizontal space
    // We don't support (size < 0.0f) in Selectable() because the ItemSpacing extension would make explicitely right-aligned sizes not visibly match other widgets.
    const bool span_all_columns = (flags & ImGuiSelectableFlags_SpanAllColumns) != 0;
    const float min_x = span_all_columns ? window->ParentWorkRect.Min.x : pos.x;
    const float max_x = span_all_columns ? window->ParentWorkRect.Max.x : window->WorkRect.Max.x;
    if (size_arg.x == 0.0f || (flags & ImGuiSelectableFlags_SpanAvailWidth))
        size.x = ImMax(label_size.x, max_x - min_x);

    // Text stays at the submission position, but bounding box may be extended on both sides
    const ImVec2 text_min = pos;
    const ImVec2 text_max(min_x + size.x, pos.y + size.y);

    // Selectables are meant to be tightly packed together with no click-gap, so we extend their box to cover spacing between selectable.
    ImRect bb(min_x, pos.y, text_max.x, text_max.y);
    if ((flags & ImGuiSelectableFlags_NoPadWithHalfSpacing) == 0)
    {
        const float spacing_x = span_all_columns ? 0.0f : style.ItemSpacing.x;
        const float spacing_y = style.ItemSpacing.y;
        const float spacing_L = IM_FLOOR(spacing_x * 0.50f);
        const float spacing_U = IM_FLOOR(spacing_y * 0.50f);
        bb.Min.x -= spacing_L;
        bb.Min.y -= spacing_U;
        bb.Max.x += (spacing_x - spacing_L);
        bb.Max.y += (spacing_y - spacing_U);
    }
    //if (g.IO.KeyCtrl) { GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(0, 255, 0, 255)); }

    // Modify ClipRect for the ItemAdd(), faster than doing a PushColumnsBackground/PushTableBackground for every Selectable..
    const float backup_clip_rect_min_x = window->ClipRect.Min.x;
    const float backup_clip_rect_max_x = window->ClipRect.Max.x;
    if (span_all_columns)
    {
        window->ClipRect.Min.x = window->ParentWorkRect.Min.x;
        window->ClipRect.Max.x = window->ParentWorkRect.Max.x;
    }

    bool item_add;
    if (flags & ImGuiSelectableFlags_Disabled)
    {
        ImGuiItemFlags backup_item_flags = window->DC.ItemFlags;
        window->DC.ItemFlags |= ImGuiItemFlags_Disabled | ImGuiItemFlags_NoNavDefaultFocus;
        item_add = ItemAdd(bb, id);
        window->DC.ItemFlags = backup_item_flags;
    }
    else
    {
        item_add = ItemAdd(bb, id);
    }

    if (span_all_columns)
    {
        window->ClipRect.Min.x = backup_clip_rect_min_x;
        window->ClipRect.Max.x = backup_clip_rect_max_x;
    }

    if (!item_add)
        return false;

    // FIXME: We can standardize the behavior of those two, we could also keep the fast path of override ClipRect + full push on render only,
    // which would be advantageous since most selectable are not selected.
    if (span_all_columns && window->DC.CurrentColumns)
        PushColumnsBackground();
    else if (span_all_columns && g.CurrentTable)
        TablePushBackgroundChannel();

    // We use NoHoldingActiveID on menus so user can click and _hold_ on a menu then drag to browse child entries
    ImGuiButtonFlags button_flags = 0;
    if (flags & ImGuiSelectableFlags_NoHoldingActiveID) { button_flags |= ImGuiButtonFlags_NoHoldingActiveId; }
    if (flags & ImGuiSelectableFlags_SelectOnClick)     { button_flags |= ImGuiButtonFlags_PressedOnClick; }
    if (flags & ImGuiSelectableFlags_SelectOnRelease)   { button_flags |= ImGuiButtonFlags_PressedOnRelease; }
    if (flags & ImGuiSelectableFlags_Disabled)          { button_flags |= ImGuiButtonFlags_Disabled; }
    if (flags & ImGuiSelectableFlags_AllowDoubleClick)  { button_flags |= ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnDoubleClick; }
    if (flags & ImGuiSelectableFlags_AllowItemOverlap)  { button_flags |= ImGuiButtonFlags_AllowItemOverlap; }

    if (flags & ImGuiSelectableFlags_Disabled)
        selected = false;

    const bool was_selected = selected;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);

    // Update NavId when clicking or when Hovering (this doesn't happen on most widgets), so navigation can be resumed with gamepad/keyboard
    if (pressed || (hovered && (flags & ImGuiSelectableFlags_SetNavIdOnHover)))
    {
        if (!g.NavDisableMouseHover && g.NavWindow == window && g.NavLayer == window->DC.NavLayerCurrent)
        {
            g.NavDisableHighlight = true;
            SetNavID(id, window->DC.NavLayerCurrent, window->DC.NavFocusScopeIdCurrent);
        }
    }
    if (pressed)
        MarkItemEdited(id);

    if (flags & ImGuiSelectableFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // In this branch, Selectable() cannot toggle the selection so this will never trigger.
    if (selected != was_selected) //-V547
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_ToggledSelection;

    // Render
    if (held && (flags & ImGuiSelectableFlags_DrawHoveredWhenHeld))
        hovered = true;
    if (hovered || selected)
    {
        const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }

    if (span_all_columns && window->DC.CurrentColumns)
        PopColumnsBackground();
    else if (span_all_columns && g.CurrentTable)
        TablePopBackgroundChannel();

    if (flags & ImGuiSelectableFlags_Disabled) PushStyleColor(ImGuiCol_Text, style.Colors[ImGuiCol_TextDisabled]);
    RenderTextClipped(text_min, text_max, label, NULL, &label_size, style.SelectableTextAlign, &bb);
    if (flags & ImGuiSelectableFlags_Disabled) PopStyleColor();

    // Automatically close popups
    if (pressed && (window->Flags & ImGuiWindowFlags_Popup) && !(flags & ImGuiSelectableFlags_DontClosePopups) && !(window->DC.ItemFlags & ImGuiItemFlags_SelectableDontClosePopup))
        CloseCurrentPopup();

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags);
    return pressed;
}